

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O2

void __thiscall Array::printArray(Array *this)

{
  int j;
  long lVar1;
  int i;
  long lVar2;
  
  for (lVar2 = 0; lVar2 < this->_height; lVar2 = lVar2 + 1) {
    for (lVar1 = 0; lVar1 < this->_width; lVar1 = lVar1 + 1) {
      printf("%4d",(ulong)(uint)this->_data[lVar2][lVar1]);
    }
    putchar(10);
  }
  return;
}

Assistant:

void Array::printArray()
{
	for (int i = 0; i < getHeight(); ++i) {
		for (int j = 0; j < getWidth(); ++j) {
			printf("%4d", _data[i][j]);
		}
		printf("\n");
	}
}